

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiViewportP *
ImGui::AddUpdateViewport
          (ImGuiWindow *window,ImGuiID id,ImVec2 *pos,ImVec2 *size,ImGuiViewportFlags flags)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  ImVec2 IVar4;
  ImGuiViewportP **ppIVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  long lVar8;
  ImGuiViewportP *this;
  ImGuiViewportP **__dest;
  int iVar9;
  int iVar10;
  long lVar11;
  ImGuiContext *g;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pIVar7 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2f0d,
                  "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                 );
  }
  uVar12 = flags | 1;
  if (window != (ImGuiWindow *)0x0) {
    if (GImGui->MovingWindow != (ImGuiWindow *)0x0) {
      if (GImGui->MovingWindow->RootWindowDockTree == window) {
        uVar12 = flags | 0xa1;
      }
    }
    uVar6 = uVar12 | 0x80;
    if ((~window->Flags & 0x40200U) != 0) {
      uVar6 = uVar12;
    }
    uVar12 = (uint)window->Flags >> 7 & 0x20 | uVar6;
  }
  lVar8 = (long)(GImGui->Viewports).Size;
  if (0 < lVar8) {
    lVar11 = 0;
    do {
      this = (GImGui->Viewports).Data[lVar11];
      if ((this->super_ImGuiViewport).ID == id) goto LAB_001376f7;
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
  }
  this = (ImGuiViewportP *)0x0;
LAB_001376f7:
  if (this == (ImGuiViewportP *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x130,GImAllocatorUserData);
    ImGuiViewportP::ImGuiViewportP(this);
    (this->super_ImGuiViewport).ID = id;
    *(int *)&(this->super_ImGuiViewport).field_0x5c = (pIVar7->Viewports).Size;
    IVar4 = *pos;
    this->LastPos = IVar4;
    (this->super_ImGuiViewport).Pos = IVar4;
    (this->super_ImGuiViewport).Size = *size;
    (this->super_ImGuiViewport).Flags = uVar12;
    UpdateViewportPlatformMonitor(this);
    iVar10 = (pIVar7->Viewports).Size;
    iVar3 = (pIVar7->Viewports).Capacity;
    if (iVar10 == iVar3) {
      iVar10 = iVar10 + 1;
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      if (iVar10 < iVar9) {
        iVar10 = iVar9;
      }
      if (iVar3 < iVar10) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData)
        ;
        ppIVar5 = (pIVar7->Viewports).Data;
        if (ppIVar5 != (ImGuiViewportP **)0x0) {
          memcpy(__dest,ppIVar5,(long)(pIVar7->Viewports).Size << 3);
          ppIVar5 = (pIVar7->Viewports).Data;
          if ((ppIVar5 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
        }
        (pIVar7->Viewports).Data = __dest;
        (pIVar7->Viewports).Capacity = iVar10;
      }
    }
    (pIVar7->Viewports).Data[(pIVar7->Viewports).Size] = this;
    (pIVar7->Viewports).Size = (pIVar7->Viewports).Size + 1;
    fVar13 = (this->super_ImGuiViewport).Pos.x;
    fVar14 = (pIVar7->DrawListSharedData).ClipRectFullscreen.x;
    fVar2 = (pIVar7->DrawListSharedData).ClipRectFullscreen.y;
    if (fVar13 <= fVar14) {
      fVar14 = fVar13;
    }
    (pIVar7->DrawListSharedData).ClipRectFullscreen.x = fVar14;
    fVar14 = (this->super_ImGuiViewport).Pos.y;
    if (fVar14 <= fVar2) {
      fVar2 = fVar14;
    }
    (pIVar7->DrawListSharedData).ClipRectFullscreen.y = fVar2;
    fVar13 = fVar13 + (this->super_ImGuiViewport).Size.x;
    fVar2 = (pIVar7->DrawListSharedData).ClipRectFullscreen.z;
    uVar12 = -(uint)(fVar13 <= fVar2);
    (pIVar7->DrawListSharedData).ClipRectFullscreen.z =
         (float)(uVar12 & (uint)fVar2 | ~uVar12 & (uint)fVar13);
    fVar13 = (pIVar7->DrawListSharedData).ClipRectFullscreen.w;
    fVar14 = fVar14 + (this->super_ImGuiViewport).Size.y;
    uVar12 = -(uint)(fVar14 <= fVar13);
    (pIVar7->DrawListSharedData).ClipRectFullscreen.w =
         (float)(uVar12 & (uint)fVar13 | ~uVar12 & (uint)fVar14);
    uVar12 = (uint)this->PlatformMonitor;
    if (uVar12 != 0xffffffff) {
      if ((this->PlatformMonitor < 0) || ((pIVar7->PlatformIO).Monitors.Size <= (int)uVar12)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,
                      "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]"
                     );
      }
      (this->super_ImGuiViewport).DpiScale = (pIVar7->PlatformIO).Monitors.Data[uVar12].DpiScale;
    }
  }
  else {
    if ((this->super_ImGuiViewport).PlatformRequestMove == false) {
      (this->super_ImGuiViewport).Pos = *pos;
    }
    if ((this->super_ImGuiViewport).PlatformRequestResize == false) {
      (this->super_ImGuiViewport).Size = *size;
    }
    (this->super_ImGuiViewport).Flags = (this->super_ImGuiViewport).Flags & 0x400U | uVar12;
  }
  this->Window = window;
  this->LastFrameActive = pIVar7->FrameCount;
  fVar13 = (this->WorkOffsetMin).x;
  fVar14 = (this->WorkOffsetMin).y;
  fVar2 = (this->super_ImGuiViewport).Pos.y;
  fVar15 = ((this->super_ImGuiViewport).Size.x - fVar13) + (this->WorkOffsetMax).x;
  fVar16 = ((this->super_ImGuiViewport).Size.y - fVar14) + (this->WorkOffsetMax).y;
  (this->super_ImGuiViewport).WorkPos.x = (this->super_ImGuiViewport).Pos.x + fVar13;
  (this->super_ImGuiViewport).WorkPos.y = fVar2 + fVar14;
  (this->super_ImGuiViewport).WorkSize.x = (float)(~-(uint)(fVar15 <= 0.0) & (uint)fVar15);
  (this->super_ImGuiViewport).WorkSize.y = (float)(~-(uint)(fVar16 <= 0.0) & (uint)fVar16);
  if (window != (ImGuiWindow *)0x0) {
    if ((this->super_ImGuiViewport).ID != window->ID) {
      __assert_fail("window == __null || viewport->ID == window->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2f40,
                    "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                   );
    }
    if (window != (ImGuiWindow *)0x0) {
      window->ViewportOwned = true;
    }
  }
  return this;
}

Assistant:

ImGuiViewportP* ImGui::AddUpdateViewport(ImGuiWindow* window, ImGuiID id, const ImVec2& pos, const ImVec2& size, ImGuiViewportFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    flags |= ImGuiViewportFlags_IsPlatformWindow;
    if (window != NULL)
    {
        if (g.MovingWindow && g.MovingWindow->RootWindowDockTree == window)
            flags |= ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_NoFocusOnAppearing;
        if ((window->Flags & ImGuiWindowFlags_NoMouseInputs) && (window->Flags & ImGuiWindowFlags_NoNavInputs))
            flags |= ImGuiViewportFlags_NoInputs;
        if (window->Flags & ImGuiWindowFlags_NoFocusOnAppearing)
            flags |= ImGuiViewportFlags_NoFocusOnAppearing;
    }

    ImGuiViewportP* viewport = (ImGuiViewportP*)FindViewportByID(id);
    if (viewport)
    {
        if (!viewport->PlatformRequestMove)
            viewport->Pos = pos;
        if (!viewport->PlatformRequestResize)
            viewport->Size = size;
        viewport->Flags = flags | (viewport->Flags & ImGuiViewportFlags_Minimized); // Preserve existing flags
    }
    else
    {
        // New viewport
        viewport = IM_NEW(ImGuiViewportP)();
        viewport->ID = id;
        viewport->Idx = g.Viewports.Size;
        viewport->Pos = viewport->LastPos = pos;
        viewport->Size = size;
        viewport->Flags = flags;
        UpdateViewportPlatformMonitor(viewport);
        g.Viewports.push_back(viewport);
        IMGUI_DEBUG_LOG_VIEWPORT("Add Viewport %08X (%s)\n", id, window->Name);

        // We normally setup for all viewports in NewFrame() but here need to handle the mid-frame creation of a new viewport.
        // We need to extend the fullscreen clip rect so the OverlayDrawList clip is correct for that the first frame
        g.DrawListSharedData.ClipRectFullscreen.x = ImMin(g.DrawListSharedData.ClipRectFullscreen.x, viewport->Pos.x);
        g.DrawListSharedData.ClipRectFullscreen.y = ImMin(g.DrawListSharedData.ClipRectFullscreen.y, viewport->Pos.y);
        g.DrawListSharedData.ClipRectFullscreen.z = ImMax(g.DrawListSharedData.ClipRectFullscreen.z, viewport->Pos.x + viewport->Size.x);
        g.DrawListSharedData.ClipRectFullscreen.w = ImMax(g.DrawListSharedData.ClipRectFullscreen.w, viewport->Pos.y + viewport->Size.y);

        // Store initial DpiScale before the OS platform window creation, based on expected monitor data.
        // This is so we can select an appropriate font size on the first frame of our window lifetime
        if (viewport->PlatformMonitor != -1)
            viewport->DpiScale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
    }

    viewport->Window = window;
    viewport->LastFrameActive = g.FrameCount;
    viewport->UpdateWorkRect();
    IM_ASSERT(window == NULL || viewport->ID == window->ID);

    if (window != NULL)
        window->ViewportOwned = true;

    return viewport;
}